

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O1

ConcatStringBuilder * __thiscall Js::ConcatStringBuilder::GetHead(ConcatStringBuilder *this)

{
  ConcatStringBuilder *pCVar1;
  
  do {
    pCVar1 = this;
    this = (this->m_prevChunk).ptr;
  } while (this != (ConcatStringBuilder *)0x0);
  return pCVar1;
}

Assistant:

ConcatStringBuilder* ConcatStringBuilder::GetHead() const
    {
        ConcatStringBuilder* current = const_cast<ConcatStringBuilder*>(this);
        ConcatStringBuilder* head;
        do
        {
            head = current;
            current = current->m_prevChunk;
        } while (current != NULL);
        return head;
    }